

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::FileDescriptorProto::Clear(FileDescriptorProto *this)

{
  void **ppvVar1;
  uint uVar2;
  Rep *pRVar3;
  undefined8 *puVar4;
  string *psVar5;
  long lVar6;
  long lVar7;
  
  lVar6 = (long)(this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar6) {
    pRVar3 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
    lVar7 = 0;
    do {
      puVar4 = (undefined8 *)pRVar3->elements[lVar7];
      lVar7 = lVar7 + 1;
      puVar4[1] = 0;
      *(undefined1 *)*puVar4 = 0;
    } while (lVar6 != lVar7);
    (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  lVar6 = (long)(this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar6) {
    pRVar3 = (this->message_type_).super_RepeatedPtrFieldBase.rep_;
    lVar7 = 0;
    do {
      ppvVar1 = pRVar3->elements + lVar7;
      lVar7 = lVar7 + 1;
      DescriptorProto::Clear((DescriptorProto *)*ppvVar1);
    } while (lVar6 != lVar7);
    (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  lVar6 = (long)(this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar6) {
    pRVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
    lVar7 = 0;
    do {
      ppvVar1 = pRVar3->elements + lVar7;
      lVar7 = lVar7 + 1;
      EnumDescriptorProto::Clear((EnumDescriptorProto *)*ppvVar1);
    } while (lVar6 != lVar7);
    (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  lVar6 = (long)(this->service_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar6) {
    pRVar3 = (this->service_).super_RepeatedPtrFieldBase.rep_;
    lVar7 = 0;
    do {
      ppvVar1 = pRVar3->elements + lVar7;
      lVar7 = lVar7 + 1;
      ServiceDescriptorProto::Clear((ServiceDescriptorProto *)*ppvVar1);
    } while (lVar6 != lVar7);
    (this->service_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  lVar6 = (long)(this->extension_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar6) {
    pRVar3 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
    lVar7 = 0;
    do {
      ppvVar1 = pRVar3->elements + lVar7;
      lVar7 = lVar7 + 1;
      FieldDescriptorProto::Clear((FieldDescriptorProto *)*ppvVar1);
    } while (lVar6 != lVar7);
    (this->extension_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  (this->public_dependency_).current_size_ = 0;
  (this->weak_dependency_).current_size_ = 0;
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 0x1f) != 0) {
    if ((uVar2 & 1) != 0) {
      psVar5 = (this->name_).ptr_;
      psVar5->_M_string_length = 0;
      *(psVar5->_M_dataplus)._M_p = '\0';
    }
    if ((uVar2 & 2) != 0) {
      psVar5 = (this->package_).ptr_;
      psVar5->_M_string_length = 0;
      *(psVar5->_M_dataplus)._M_p = '\0';
    }
    if ((uVar2 & 4) != 0) {
      psVar5 = (this->syntax_).ptr_;
      psVar5->_M_string_length = 0;
      *(psVar5->_M_dataplus)._M_p = '\0';
    }
    if ((uVar2 & 8) != 0) {
      FileOptions::Clear(this->options_);
    }
    if ((uVar2 & 0x10) != 0) {
      SourceCodeInfo::Clear(this->source_code_info_);
    }
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void FileDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FileDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  dependency_.Clear();
  message_type_.Clear();
  enum_type_.Clear();
  service_.Clear();
  extension_.Clear();
  public_dependency_.Clear();
  weak_dependency_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000001fu) {
    if (cached_has_bits & 0x00000001u) {
      name_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      package_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000004u) {
      syntax_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000008u) {
      GOOGLE_DCHECK(options_ != nullptr);
      options_->Clear();
    }
    if (cached_has_bits & 0x00000010u) {
      GOOGLE_DCHECK(source_code_info_ != nullptr);
      source_code_info_->Clear();
    }
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}